

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

void __thiscall leveldb::_Test_DestroyEmptyDir::_Run(_Test_DestroyEmptyDir *this)

{
  bool bVar1;
  Env *base;
  Tester local_1668;
  Status local_14c8;
  Tester local_14c0;
  size_type local_1320;
  int local_1314;
  Tester local_1310;
  undefined1 local_1170 [424];
  Tester local_fc8;
  undefined1 local_e28 [424];
  Tester local_c80;
  Status local_ae0;
  Tester local_ad8;
  size_type local_938;
  int local_92c;
  Tester local_928;
  undefined1 local_788 [424];
  undefined1 local_5e0 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  children;
  undefined1 local_428 [424];
  undefined1 local_280 [8];
  Options opts;
  undefined1 local_80 [8];
  undefined1 local_78 [8];
  TestEnv env;
  string local_50 [32];
  undefined1 local_30 [8];
  string dbname;
  _Test_DestroyEmptyDir *this_local;
  
  test::TmpDir_abi_cxx11_();
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_30,
                 (char *)local_50);
  std::__cxx11::string::~string(local_50);
  base = Env::Default();
  TestEnv::TestEnv((TestEnv *)local_78,base);
  EnvWrapper::DeleteDir((EnvWrapper *)local_80,(string *)local_78);
  Status::~Status((Status *)local_80);
  test::Tester::Tester
            ((Tester *)&opts.filter_policy,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x67c);
  bVar1 = EnvWrapper::FileExists((EnvWrapper *)local_78,(string *)local_30);
  test::Tester::Is((Tester *)&opts.filter_policy,(bool)(~bVar1 & 1),"!env.FileExists(dbname)");
  test::Tester::~Tester((Tester *)&opts.filter_policy);
  Options::Options((Options *)local_280);
  opts._8_8_ = local_78;
  test::Tester::Tester
            ((Tester *)(local_428 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x681);
  EnvWrapper::CreateDir((EnvWrapper *)local_428,(string *)local_78);
  test::Tester::IsOk((Tester *)(local_428 + 8),(Status *)local_428);
  Status::~Status((Status *)local_428);
  test::Tester::~Tester((Tester *)(local_428 + 8));
  test::Tester::Tester
            ((Tester *)
             &children.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x682);
  bVar1 = EnvWrapper::FileExists((EnvWrapper *)local_78,(string *)local_30);
  test::Tester::Is((Tester *)
                   &children.
                    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_end_of_storage,bVar1,
                   "env.FileExists(dbname)");
  test::Tester::~Tester
            ((Tester *)
             &children.
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_5e0);
  test::Tester::Tester
            ((Tester *)(local_788 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x684);
  TestEnv::GetChildren
            ((TestEnv *)local_788,(string *)local_78,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_30);
  test::Tester::IsOk((Tester *)(local_788 + 8),(Status *)local_788);
  Status::~Status((Status *)local_788);
  test::Tester::~Tester((Tester *)(local_788 + 8));
  test::Tester::Tester
            (&local_928,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x686);
  local_92c = 2;
  local_938 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_5e0);
  test::Tester::IsEq<int,unsigned_long>(&local_928,&local_92c,&local_938);
  test::Tester::~Tester(&local_928);
  test::Tester::Tester
            (&local_ad8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x687);
  DestroyDB((leveldb *)&local_ae0,(string *)local_30,(Options *)local_280);
  test::Tester::IsOk(&local_ad8,&local_ae0);
  Status::~Status(&local_ae0);
  test::Tester::~Tester(&local_ad8);
  test::Tester::Tester
            (&local_c80,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x688);
  bVar1 = EnvWrapper::FileExists((EnvWrapper *)local_78,(string *)local_30);
  test::Tester::Is(&local_c80,(bool)(~bVar1 & 1),"!env.FileExists(dbname)");
  test::Tester::~Tester(&local_c80);
  TestEnv::SetIgnoreDotFiles((TestEnv *)local_78,true);
  test::Tester::Tester
            ((Tester *)(local_e28 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x68c);
  EnvWrapper::CreateDir((EnvWrapper *)local_e28,(string *)local_78);
  test::Tester::IsOk((Tester *)(local_e28 + 8),(Status *)local_e28);
  Status::~Status((Status *)local_e28);
  test::Tester::~Tester((Tester *)(local_e28 + 8));
  test::Tester::Tester
            (&local_fc8,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x68d);
  bVar1 = EnvWrapper::FileExists((EnvWrapper *)local_78,(string *)local_30);
  test::Tester::Is(&local_fc8,bVar1,"env.FileExists(dbname)");
  test::Tester::~Tester(&local_fc8);
  test::Tester::Tester
            ((Tester *)(local_1170 + 8),
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x68e);
  TestEnv::GetChildren
            ((TestEnv *)local_1170,(string *)local_78,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_30);
  test::Tester::IsOk((Tester *)(local_1170 + 8),(Status *)local_1170);
  Status::~Status((Status *)local_1170);
  test::Tester::~Tester((Tester *)(local_1170 + 8));
  test::Tester::Tester
            (&local_1310,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x68f);
  local_1314 = 0;
  local_1320 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       *)local_5e0);
  test::Tester::IsEq<int,unsigned_long>(&local_1310,&local_1314,&local_1320);
  test::Tester::~Tester(&local_1310);
  test::Tester::Tester
            (&local_14c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x690);
  DestroyDB((leveldb *)&local_14c8,(string *)local_30,(Options *)local_280);
  test::Tester::IsOk(&local_14c0,&local_14c8);
  Status::~Status(&local_14c8);
  test::Tester::~Tester(&local_14c0);
  test::Tester::Tester
            (&local_1668,
             "/workspace/llm4binary/github/license_all_cmakelists_25/CDDSCLab[P]leveldb/db/db_test.cc"
             ,0x691);
  bVar1 = EnvWrapper::FileExists((EnvWrapper *)local_78,(string *)local_30);
  test::Tester::Is(&local_1668,(bool)(~bVar1 & 1),"!env.FileExists(dbname)");
  test::Tester::~Tester(&local_1668);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_5e0);
  TestEnv::~TestEnv((TestEnv *)local_78);
  std::__cxx11::string::~string((string *)local_30);
  return;
}

Assistant:

TEST(DBTest, DestroyEmptyDir) {
  std::string dbname = test::TmpDir() + "/db_empty_dir";
  TestEnv env(Env::Default());
  env.DeleteDir(dbname);
  ASSERT_TRUE(!env.FileExists(dbname));

  Options opts;
  opts.env = &env;

  ASSERT_OK(env.CreateDir(dbname));
  ASSERT_TRUE(env.FileExists(dbname));
  std::vector<std::string> children;
  ASSERT_OK(env.GetChildren(dbname, &children));
  // The stock Env's do not filter out '.' and '..' special files.
  ASSERT_EQ(2, children.size());
  ASSERT_OK(DestroyDB(dbname, opts));
  ASSERT_TRUE(!env.FileExists(dbname));

  // Should also be destroyed if Env is filtering out dot files.
  env.SetIgnoreDotFiles(true);
  ASSERT_OK(env.CreateDir(dbname));
  ASSERT_TRUE(env.FileExists(dbname));
  ASSERT_OK(env.GetChildren(dbname, &children));
  ASSERT_EQ(0, children.size());
  ASSERT_OK(DestroyDB(dbname, opts));
  ASSERT_TRUE(!env.FileExists(dbname));
}